

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_NoHandClaim_Test::testBody(TEST_WiningStateTest_NoHandClaim_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 uVar6;
  undefined8 uVar5;
  int value;
  NormalTestTerminator local_d8;
  NormalTestTerminator local_d0;
  SimpleString local_c8;
  SimpleString local_c0;
  NormalTestTerminator local_b8 [3];
  undefined1 local_a0 [8];
  DoublingFactorReport r;
  TEST_WiningStateTest_NoHandClaim_Test *this_local;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  TEST_GROUP_CppUTestGroupWiningStateTest::addNoWiningHand
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,true);
  r.doubling_factor = 0;
  TEST_GROUP_CppUTestGroupWiningStateTest::selfDrawn
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,(SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a0,
             &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::empty((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile);
  local_b8[0].super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
  NormalTestTerminator::NormalTestTerminator(local_b8);
  uVar5 = CONCAT44(uVar6,0x52);
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","r.patterns.empty()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
             ,uVar5,local_b8);
  value = (int)((ulong)uVar5 >> 0x20);
  NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1ddf6b);
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 0) {
    pUVar2 = UtestShell::getCurrent();
    local_d8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_d8);
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0x53,&local_d8);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1de1a7);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar3 = SimpleString::asCharString(&local_c0);
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_d0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_d0);
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,CONCAT44(value,0x53),&local_d0);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1de0bb);
    SimpleString::~SimpleString((SimpleString *)0x1de0c7);
    SimpleString::~SimpleString((SimpleString *)0x1de0d3);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a0);
  return;
}

Assistant:

TEST(WiningStateTest, NoHandClaim)
{
	addNoWiningHand(true);

	selfDrawn();
	auto r = c.report();

	CHECK(r.patterns.empty());
	CHECK_EQUAL(0, r.doubling_factor);
}